

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O3

void Min_CoverExpand(Min_Man_t *p,Min_Cube_t *pCover)

{
  Min_Cube_t *pMVar1;
  Min_Cube_t **ppMVar2;
  int iVar3;
  uint uVar4;
  
  Min_ManClean(p,p->nVars);
  if (pCover != (Min_Cube_t *)0x0) {
    iVar3 = p->nCubes;
    do {
      iVar3 = iVar3 + 1;
      pMVar1 = pCover->pNext;
      ppMVar2 = p->ppStore;
      uVar4 = *(uint *)&pCover->field_0x8 >> 0x16;
      pCover->pNext = ppMVar2[uVar4];
      ppMVar2[uVar4] = pCover;
      p->nCubes = iVar3;
      pCover = pMVar1;
    } while (pMVar1 != (Min_Cube_t *)0x0);
  }
  return;
}

Assistant:

void Min_CoverExpand( Min_Man_t * p, Min_Cube_t * pCover )
{
    Min_Cube_t * pCube, * pCube2;
    Min_ManClean( p, p->nVars );
    Min_CoverForEachCubeSafe( pCover, pCube, pCube2 )
    {
        pCube->pNext = p->ppStore[pCube->nLits];
        p->ppStore[pCube->nLits] = pCube;
        p->nCubes++;
    }
}